

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O0

int cs::copy(EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  bool bVar1;
  EVP_PKEY_CTX *pEVar2;
  void *__child_stack;
  void *in_R8;
  any *in_stack_00000020;
  EVP_PKEY_CTX *this;
  EVP_PKEY_CTX *this_00;
  
  pEVar2 = dst;
  this = src;
  this_00 = dst;
  bVar1 = cs_impl::any::is_rvalue((any *)src);
  if (bVar1) {
    cs_impl::any::mark_as_rvalue((any *)this,false);
  }
  else {
    cs_impl::any::clone((any *)this,(__fn *)src,__child_stack,(int)pEVar2,in_R8);
    cs_impl::any::detach(in_stack_00000020);
  }
  cs_impl::any::any((any *)this_00,(any *)this);
  return (int)dst;
}

Assistant:

var copy(var val)
	{
		if (!val.is_rvalue()) {
			val.clone();
			val.detach();
		}
		else
			val.mark_as_rvalue(false);
		return val;
	}